

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.c
# Opt level: O0

int luv_pipe_connect(lua_State *L)

{
  int callback_ref;
  uv_pipe_t *handle_00;
  char *name_00;
  uv_connect_t *req_00;
  luv_req_t *plVar1;
  uv_connect_t *req;
  int ref;
  char *name;
  uv_pipe_t *handle;
  lua_State *L_local;
  
  handle_00 = luv_check_pipe(L,1);
  name_00 = luaL_checklstring(L,2,(size_t *)0x0);
  callback_ref = luv_check_continuation(L,3);
  req_00 = (uv_connect_t *)lua_newuserdata(L,0x60);
  plVar1 = luv_setup_req(L,callback_ref);
  req_00->data = plVar1;
  uv_pipe_connect(req_00,handle_00,name_00,luv_connect_cb);
  return 1;
}

Assistant:

static int luv_pipe_connect(lua_State* L) {
  luv_ctx_t* ctx = luv_context(L);
  uv_pipe_t* handle = luv_check_pipe(L, 1);
  const char* name = luaL_checkstring(L, 2);
  int ref = luv_check_continuation(L, 3);
  uv_connect_t* req = (uv_connect_t*)lua_newuserdata(L, sizeof(*req));
  req->data = luv_setup_req(L, ctx, ref);
  uv_pipe_connect(req, handle, name, luv_connect_cb);
  return 1;
}